

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix_sparse.c
# Opt level: O0

int check_vector(N_Vector x,N_Vector y,sunrealtype tol)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined8 in_XMM0_Qa;
  sunindextype i;
  sunindextype yldata;
  sunindextype xldata;
  sunrealtype *ydata;
  sunrealtype *xdata;
  int failure;
  long local_50;
  int local_24;
  int local_4;
  
  local_24 = 0;
  lVar2 = N_VGetArrayPointer(in_RDI);
  lVar3 = N_VGetArrayPointer(in_RSI);
  lVar4 = N_VGetLength_Serial(in_RDI);
  lVar5 = N_VGetLength_Serial(in_RSI);
  if (lVar4 == lVar5) {
    for (local_50 = 0; local_50 < lVar4; local_50 = local_50 + 1) {
      iVar1 = SUNRCompareTol(*(undefined8 *)(lVar2 + local_50 * 8),
                             *(undefined8 *)(lVar3 + local_50 * 8),in_XMM0_Qa);
      local_24 = iVar1 + local_24;
    }
    if ((double)local_24 <= 0.0) {
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  else {
    printf(">>> ERROR: check_vector: Different data array lengths \n");
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int check_vector(N_Vector x, N_Vector y, sunrealtype tol)
{
  int failure = 0;
  sunrealtype *xdata, *ydata;
  sunindextype xldata, yldata;
  sunindextype i;

  /* get vector data */
  xdata = N_VGetArrayPointer(x);
  ydata = N_VGetArrayPointer(y);

  /* check data lengths */
  xldata = N_VGetLength_Serial(x);
  yldata = N_VGetLength_Serial(y);

  if (xldata != yldata)
  {
    printf(">>> ERROR: check_vector: Different data array lengths \n");
    return (1);
  }

  /* check vector data */
  for (i = 0; i < xldata; i++)
  {
    failure += SUNRCompareTol(xdata[i], ydata[i], tol);
  }

  if (failure > ZERO) { return (1); }
  else { return (0); }
}